

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O0

size_t private_ACUtils_ADynArray_growStrategyGeneric
                 (size_t requiredSize,size_t minCapacity,size_t maxCapacity,double multiplier,
                 size_t maxDifSize)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 local_48;
  size_t capacity;
  double multiplierExponent;
  size_t maxDifSize_local;
  double multiplier_local;
  size_t maxCapacity_local;
  size_t minCapacity_local;
  size_t requiredSize_local;
  undefined4 uVar7;
  
  requiredSize_local = minCapacity;
  if (minCapacity < requiredSize) {
    auVar4._8_4_ = (int)(requiredSize >> 0x20);
    auVar4._0_8_ = requiredSize;
    auVar4._12_4_ = 0x45300000;
    uVar7 = (undefined4)(minCapacity >> 0x20);
    auVar6._8_4_ = uVar7;
    auVar6._0_8_ = minCapacity;
    auVar6._12_4_ = 0x45300000;
    dVar2 = log(((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)requiredSize) - 4503599627370496.0)) /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)minCapacity) - 4503599627370496.0)));
    dVar3 = log(multiplier);
    dVar2 = ceil(dVar2 / dVar3);
    auVar5._8_4_ = uVar7;
    auVar5._0_8_ = minCapacity;
    auVar5._12_4_ = 0x45300000;
    dVar2 = pow(multiplier,dVar2);
    dVar2 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)minCapacity) - 4503599627370496.0)) * dVar2;
    uVar1 = (ulong)dVar2;
    local_48 = uVar1 | (long)(dVar2 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f;
    if (maxDifSize < local_48 - requiredSize) {
      local_48 = requiredSize + maxDifSize;
    }
    if (maxCapacity < local_48) {
      local_48 = maxCapacity;
    }
    requiredSize_local = local_48;
  }
  return requiredSize_local;
}

Assistant:

ACUTILS_HD_FUNC size_t private_ACUtils_ADynArray_growStrategyGeneric(size_t requiredSize, size_t minCapacity, size_t maxCapacity, double multiplier, size_t maxDifSize) {
    double multiplierExponent;
    size_t capacity;
    if(requiredSize <= minCapacity)
        return minCapacity;
    multiplierExponent = ceil(log((double) requiredSize / minCapacity) / log(multiplier));
    capacity = (size_t) (minCapacity * pow(multiplier, multiplierExponent));
    if(capacity - requiredSize > maxDifSize)
        capacity = requiredSize + maxDifSize;
    if(capacity > maxCapacity)
        capacity = maxCapacity;
    return capacity;
}